

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatorprofile.cpp
# Opt level: O0

void __thiscall
libcellml::GeneratorProfile::setImplementationComputeVariablesMethodString
          (GeneratorProfile *this,bool forDifferentialModel,bool withExternalVariables,
          string *implementationComputeVariablesMethodString)

{
  string *implementationComputeVariablesMethodString_local;
  bool withExternalVariables_local;
  bool forDifferentialModel_local;
  GeneratorProfile *this_local;
  
  if (forDifferentialModel) {
    if (withExternalVariables) {
      std::__cxx11::string::operator=
                ((string *)&this->mPimpl->mImplementationComputeVariablesMethodFdmWevString,
                 (string *)implementationComputeVariablesMethodString);
    }
    else {
      std::__cxx11::string::operator=
                ((string *)&this->mPimpl->mImplementationComputeVariablesMethodFdmWoevString,
                 (string *)implementationComputeVariablesMethodString);
    }
  }
  else if (withExternalVariables) {
    std::__cxx11::string::operator=
              ((string *)&this->mPimpl->mImplementationComputeVariablesMethodFamWevString,
               (string *)implementationComputeVariablesMethodString);
  }
  else {
    std::__cxx11::string::operator=
              ((string *)&this->mPimpl->mImplementationComputeVariablesMethodFamWoevString,
               (string *)implementationComputeVariablesMethodString);
  }
  return;
}

Assistant:

void GeneratorProfile::setImplementationComputeVariablesMethodString(bool forDifferentialModel,
                                                                     bool withExternalVariables,
                                                                     const std::string &implementationComputeVariablesMethodString)
{
    if (forDifferentialModel) {
        if (withExternalVariables) {
            mPimpl->mImplementationComputeVariablesMethodFdmWevString = implementationComputeVariablesMethodString;
        } else {
            mPimpl->mImplementationComputeVariablesMethodFdmWoevString = implementationComputeVariablesMethodString;
        }
    } else {
        if (withExternalVariables) {
            mPimpl->mImplementationComputeVariablesMethodFamWevString = implementationComputeVariablesMethodString;
        } else {
            mPimpl->mImplementationComputeVariablesMethodFamWoevString = implementationComputeVariablesMethodString;
        }
    }
}